

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaObjectBuilder::addMetaObject
          (QMetaObjectBuilder *this,QMetaObject *prototype,AddMembers members)

{
  bool bVar1;
  QFlags<QMetaObjectBuilder::AddMember> QVar2;
  MethodType MVar3;
  int iVar4;
  int iVar5;
  QFlagsStorage<QMetaObjectBuilder::AddMember> QVar6;
  QMetaObject *pQVar7;
  int __type;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  long in_RSI;
  char *__name;
  QMetaObjectBuilder *in_RDI;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar8;
  QMetaPropertyBuilder QVar9;
  QMetaEnumBuilder QVar10;
  SuperData *objects;
  int index;
  QMetaClassInfo ci;
  QMetaMethod method;
  undefined4 in_stack_fffffffffffffd08;
  AddMember in_stack_fffffffffffffd0c;
  enum_type in_stack_fffffffffffffd10;
  enum_type in_stack_fffffffffffffd14;
  QMetaClassInfo *in_stack_fffffffffffffd18;
  QMetaObjectBuilder *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  uint index_00;
  uint in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  uint in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  SuperData *local_2a0;
  QMetaMethod *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  QMetaObjectBuilder *in_stack_fffffffffffffd80;
  QMetaObjectBuilder *in_stack_fffffffffffffd88;
  QMetaMethod *in_stack_fffffffffffffdb8;
  QMetaObjectBuilder *in_stack_fffffffffffffdc0;
  uint local_144;
  CompareAgainstLiteralZero local_12a;
  CompareAgainstLiteralZero local_129 [49];
  QMetaClassInfo local_f8;
  CompareAgainstLiteralZero local_e1;
  QMetaEnum local_e0;
  CompareAgainstLiteralZero local_c9 [40];
  CompareAgainstLiteralZero local_a1;
  QMetaMethod local_a0;
  CompareAgainstLiteralZero local_8f;
  CompareAgainstLiteralZero local_8e;
  CompareAgainstLiteralZero local_8d;
  CompareAgainstLiteralZero local_8c;
  CompareAgainstLiteralZero local_8b;
  CompareAgainstLiteralZero local_8a;
  CompareAgainstLiteralZero local_89;
  QMetaMethod local_88;
  CompareAgainstLiteralZero local_75;
  QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4> local_74;
  CompareAgainstLiteralZero local_6e;
  CompareAgainstLiteralZero local_6d [5];
  QMetaObjectBuilder *local_68;
  int local_60;
  QMetaObjectBuilder *local_58;
  int local_50;
  QMetaObjectBuilder *local_48;
  int local_40;
  QMetaObjectBuilder *local_38;
  int local_30;
  QMetaObjectBuilder *local_28;
  int local_20;
  QMetaObjectBuilder *local_18;
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(local_6d,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    QMetaObject::className
              ((QMetaObject *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_6e,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    pQVar7 = QMetaObject::superClass((QMetaObject *)0x370716);
    in_RDI->d->superClass = pQVar7;
  }
  local_74.super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i =
       (QFlagsStorage<QMetaObjectBuilder::AddMember>)
       ::operator|(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10);
  QFlags<QMetaObjectBuilder::AddMember>::operator|
            ((QFlags<QMetaObjectBuilder::AddMember> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),in_stack_fffffffffffffd0c
            );
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>)
                     SUB84(in_stack_fffffffffffffd18,0));
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_75,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    local_144 = QMetaObject::methodOffset
                          ((QMetaObject *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    while (in_stack_fffffffffffffd3c = local_144,
          iVar5 = QMetaObject::methodCount((QMetaObject *)in_stack_fffffffffffffd20),
          (int)in_stack_fffffffffffffd3c < iVar5) {
      local_88.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      __name = (char *)(ulong)local_144;
      local_88 = QMetaObject::method((QMetaObject *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                     (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      MVar3 = QMetaMethod::methodType
                        ((QMetaMethod *)
                         CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      if (MVar3 == Signal) {
LAB_003709b3:
        MVar3 = QMetaMethod::methodType
                          ((QMetaMethod *)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (MVar3 == Method) {
          QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                            ((QFlags<QMetaObjectBuilder::AddMember> *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             in_stack_fffffffffffffd0c);
          QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_8c,0);
          bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                               super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
          if (bVar1) {
            QVar8 = addMethod(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            local_18 = QVar8._mobj;
            local_10 = QVar8._index;
            goto LAB_00370b88;
          }
        }
        MVar3 = QMetaMethod::methodType
                          ((QMetaMethod *)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (MVar3 == Signal) {
          QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                            ((QFlags<QMetaObjectBuilder::AddMember> *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             in_stack_fffffffffffffd0c);
          QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_8d,0);
          bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                               super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
          if (bVar1) {
            QVar8 = addMethod(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            local_28 = QVar8._mobj;
            local_20 = QVar8._index;
            goto LAB_00370b88;
          }
        }
        MVar3 = QMetaMethod::methodType
                          ((QMetaMethod *)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (MVar3 == Slot) {
          QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                            ((QFlags<QMetaObjectBuilder::AddMember> *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             in_stack_fffffffffffffd0c);
          QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_8e,0);
          bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                               super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
          if (bVar1) {
            QVar8 = addMethod(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            local_38 = QVar8._mobj;
            local_30 = QVar8._index;
          }
        }
      }
      else {
        iVar4 = QMetaMethod::access(&local_88,__name,__type);
        iVar5 = extraout_EDX;
        if (iVar4 != 2) {
LAB_003708c3:
          iVar4 = QMetaMethod::access(&local_88,__name,iVar5);
          iVar5 = extraout_EDX_01;
          if (iVar4 == 0) {
            QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                              ((QFlags<QMetaObjectBuilder::AddMember> *)
                               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                               in_stack_fffffffffffffd0c);
            __name = (char *)0x0;
            QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_8a,0);
            bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                                 super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
            iVar5 = extraout_EDX_02;
            if (bVar1) goto LAB_00370b88;
          }
          iVar5 = QMetaMethod::access(&local_88,__name,iVar5);
          if (iVar5 == 1) {
            QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                              ((QFlags<QMetaObjectBuilder::AddMember> *)
                               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                               in_stack_fffffffffffffd0c);
            QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_8b,0);
            bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                                 super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
            if (bVar1) goto LAB_00370b88;
          }
          goto LAB_003709b3;
        }
        QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                          ((QFlags<QMetaObjectBuilder::AddMember> *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                           in_stack_fffffffffffffd0c);
        __name = (char *)0x0;
        QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_89,0);
        bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
        iVar5 = extraout_EDX_00;
        if (!bVar1) goto LAB_003708c3;
      }
LAB_00370b88:
      local_144 = local_144 + 1;
    }
  }
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_8f,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    local_144 = 0;
    while (in_stack_fffffffffffffd38 = local_144,
          iVar5 = QMetaObject::constructorCount((QMetaObject *)0x370c26),
          (int)in_stack_fffffffffffffd38 < iVar5) {
      local_a0 = QMetaObject::constructor
                           ((QMetaObject *)
                            CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                            (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      QVar8 = addConstructor((QMetaObjectBuilder *)
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                             in_stack_fffffffffffffd70);
      local_48 = QVar8._mobj;
      local_40 = QVar8._index;
      local_144 = local_144 + 1;
    }
  }
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_a1,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    local_144 = QMetaObject::propertyOffset
                          ((QMetaObject *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    while (in_stack_fffffffffffffd34 = local_144,
          iVar5 = QMetaObject::propertyCount((QMetaObject *)in_stack_fffffffffffffd20),
          (int)in_stack_fffffffffffffd34 < iVar5) {
      QMetaObject::property
                ((QMetaObject *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd2c);
      QVar9 = addProperty(in_stack_fffffffffffffd80,
                          (QMetaProperty *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_58 = QVar9._mobj;
      local_50 = QVar9._index;
      local_144 = local_144 + 1;
    }
  }
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(local_c9,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    local_144 = QMetaObject::enumeratorOffset
                          ((QMetaObject *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    while (in_stack_fffffffffffffd30 = local_144,
          iVar5 = QMetaObject::enumeratorCount((QMetaObject *)in_stack_fffffffffffffd20),
          (int)in_stack_fffffffffffffd30 < iVar5) {
      local_e0 = QMetaObject::enumerator
                           ((QMetaObject *)
                            CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                            (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      QVar10 = addEnumerator(in_stack_fffffffffffffd88,(QMetaEnum *)in_stack_fffffffffffffd80);
      local_68 = QVar10._mobj;
      local_60 = QVar10._index;
      local_144 = local_144 + 1;
    }
  }
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_e1,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if (bVar1) {
    local_144 = QMetaObject::classInfoOffset
                          ((QMetaObject *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    while (index_00 = local_144,
          iVar5 = QMetaObject::classInfoCount((QMetaObject *)in_stack_fffffffffffffd20),
          (int)index_00 < iVar5) {
      local_f8.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8 = QMetaObject::classInfo
                           ((QMetaObject *)
                            CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),index_00);
      in_stack_fffffffffffffd18 = &local_f8;
      QMetaClassInfo::name(in_stack_fffffffffffffd18);
      QByteArray::QByteArray
                ((QByteArray *)in_RDI,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      in_stack_fffffffffffffd20 =
           (QMetaObjectBuilder *)QMetaClassInfo::value(in_stack_fffffffffffffd18);
      QByteArray::QByteArray
                ((QByteArray *)in_RDI,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      addClassInfo(in_stack_fffffffffffffd20,(QByteArray *)in_stack_fffffffffffffd18,
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      QByteArray::~QByteArray((QByteArray *)0x370fb6);
      QByteArray::~QByteArray((QByteArray *)0x370fc3);
      local_144 = local_144 + 1;
    }
  }
  QVar6.i = (Int)QFlags<QMetaObjectBuilder::AddMember>::operator&
                           ((QFlags<QMetaObjectBuilder::AddMember> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(local_129,0);
  bVar1 = ::operator!=(QVar6.i);
  if ((bVar1) && (local_2a0 = *(SuperData **)(in_RSI + 0x20), local_2a0 != (SuperData *)0x0)) {
    while (pQVar7 = QMetaObject::SuperData::operator_cast_to_QMetaObject_(local_2a0),
          pQVar7 != (QMetaObject *)0x0) {
      QMetaObject::SuperData::operator_cast_to_QMetaObject_(local_2a0);
      addRelatedMetaObject(in_stack_fffffffffffffd20,(QMetaObject *)in_stack_fffffffffffffd18);
      local_2a0 = local_2a0 + 1;
    }
  }
  QVar2 = QFlags<QMetaObjectBuilder::AddMember>::operator&
                    ((QFlags<QMetaObjectBuilder::AddMember> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_12a,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i);
  if ((bVar1) && (*(long *)(in_RSI + 0x18) != 0)) {
    setStaticMetacallFunction(in_RDI,*(StaticMetacallFunction *)(in_RSI + 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMetaObjectBuilder::addMetaObject(const QMetaObject *prototype,
                                       QMetaObjectBuilder::AddMembers members)
{
    Q_ASSERT(prototype);
    int index;

    if ((members & ClassName) != 0)
        d->className = prototype->className();

    if ((members & SuperClass) != 0)
        d->superClass = prototype->superClass();

    if ((members & (Methods | Signals | Slots)) != 0) {
        for (index = prototype->methodOffset(); index < prototype->methodCount(); ++index) {
            QMetaMethod method = prototype->method(index);
            if (method.methodType() != QMetaMethod::Signal) {
                if (method.access() == QMetaMethod::Public && (members & PublicMethods) == 0)
                    continue;
                if (method.access() == QMetaMethod::Private && (members & PrivateMethods) == 0)
                    continue;
                if (method.access() == QMetaMethod::Protected && (members & ProtectedMethods) == 0)
                    continue;
            }
            if (method.methodType() == QMetaMethod::Method && (members & Methods) != 0) {
                addMethod(method);
            } else if (method.methodType() == QMetaMethod::Signal &&
                       (members & Signals) != 0) {
                addMethod(method);
            } else if (method.methodType() == QMetaMethod::Slot &&
                       (members & Slots) != 0) {
                addMethod(method);
            }
        }
    }

    if ((members & Constructors) != 0) {
        for (index = 0; index < prototype->constructorCount(); ++index)
            addConstructor(prototype->constructor(index));
    }

    if ((members & Properties) != 0) {
        for (index = prototype->propertyOffset(); index < prototype->propertyCount(); ++index)
            addProperty(prototype->property(index));
    }

    if ((members & Enumerators) != 0) {
        for (index = prototype->enumeratorOffset(); index < prototype->enumeratorCount(); ++index)
            addEnumerator(prototype->enumerator(index));
    }

    if ((members & ClassInfos) != 0) {
        for (index = prototype->classInfoOffset(); index < prototype->classInfoCount(); ++index) {
            QMetaClassInfo ci = prototype->classInfo(index);
            addClassInfo(ci.name(), ci.value());
        }
    }

    if ((members & RelatedMetaObjects) != 0) {
        Q_ASSERT(qmobPriv(prototype->d.data)->revision >= 2);
        const auto *objects = prototype->d.relatedMetaObjects;
        if (objects) {
            while (*objects != nullptr) {
                addRelatedMetaObject(*objects);
                ++objects;
            }
        }
    }

    if ((members & StaticMetacall) != 0) {
        Q_ASSERT(qmobPriv(prototype->d.data)->revision >= 6);
        if (prototype->d.static_metacall)
            setStaticMetacallFunction(prototype->d.static_metacall);
    }
}